

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  byte bVar11;
  bool bVar12;
  stbtt__buf fontdict;
  bool bVar13;
  bool bVar14;
  float fVar15;
  stbtt_uint32 sVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  int *piVar20;
  uchar uVar21;
  undefined1 uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  uchar *puVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  float fVar39;
  float dy1;
  float fVar40;
  float dy2;
  float fVar41;
  float dx3;
  float fVar42;
  float fVar43;
  stbtt__buf b;
  stbtt__buf sVar44;
  undefined4 local_258;
  undefined4 uStack_254;
  undefined8 in_stack_fffffffffffffdb8;
  ulong local_230;
  ulong uVar45;
  undefined4 in_stack_fffffffffffffde0;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  puVar30 = (info->subrs).data;
  local_108.cursor = (info->subrs).cursor;
  local_108.size = (info->subrs).size;
  sVar44 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar38 = sVar44._8_8_;
  local_258 = sVar44.data._0_4_;
  uStack_254 = sVar44.data._4_4_;
  uVar19 = sVar44.size;
  if ((int)uVar19 <= sVar44.cursor) {
switchD_0014140a_default:
    return 0;
  }
  local_108.data = puVar30;
  local_e0 = &(info->gsubrs).cursor;
  bVar13 = true;
  uVar45 = 0;
  local_230 = 0;
  bVar14 = false;
  uVar36 = 0;
  local_1d0 = info;
LAB_0014103f:
  fVar39 = s[0xb];
  dy2 = s[9];
  fVar15 = s[8];
  dy1 = s[7];
  dx3 = s[6];
  fVar43 = s[5];
  fVar42 = s[4];
  fVar41 = s[3];
  fVar40 = s[2];
  uVar23 = (uint)uVar38;
  uVar26 = uVar23 + 1;
  bVar11 = *(byte *)(CONCAT44(uStack_254,local_258) + (long)(int)uVar23);
  uVar35 = (uint)uVar36;
  iVar27 = (int)local_230;
  switch(bVar11) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    uVar45 = (ulong)(uint)((int)uVar45 + ((int)((int)(uVar36 >> 0x1f) + uVar35) >> 1));
    goto LAB_00141cab;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_00141069_caseD_2:
    if (bVar11 < 0x20) {
      return 0;
    }
    if (bVar11 == 0xff) goto LAB_0014117f;
  case 0x1c:
    if ((int)uVar19 < (int)uVar23) {
      uVar23 = uVar19;
    }
    bVar12 = (int)uVar26 < 1;
    uVar26 = uVar23;
    if (bVar12) {
      uVar26 = uVar19;
    }
    sVar16 = stbtt__cff_int((stbtt__buf *)&local_258);
    fVar39 = (float)(int)(short)sVar16;
LAB_001411be:
    if (0x2f < (int)uVar35) {
      return 0;
    }
    s[(int)uVar35] = fVar39;
    uVar37 = (ulong)(uVar35 + 1);
    break;
  case 4:
    if ((int)uVar35 < 1) {
      return 0;
    }
    fVar39 = s[uVar35 - 1];
    fVar40 = 0.0;
    goto LAB_001416eb;
  case 5:
    if ((int)uVar35 < 2) {
      return 0;
    }
    uVar38 = 1;
    do {
      uVar2 = c->x;
      uVar7 = c->y;
      fVar39 = (float)uVar2 + (float)*(undefined8 *)(s + (uVar38 - 1));
      fVar40 = (float)uVar7 + (float)((ulong)*(undefined8 *)(s + (uVar38 - 1)) >> 0x20);
      c->x = fVar39;
      c->y = fVar40;
      uVar37 = 0;
      stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
      uVar38 = uVar38 + 2;
    } while (uVar38 < uVar36);
    break;
  case 6:
    iVar27 = 0;
    if ((int)uVar35 < 1) {
      return 0;
    }
    for (; iVar27 < (int)uVar35; iVar27 = iVar27 + 1) {
      uVar4 = c->x;
      uVar9 = c->y;
      fVar39 = s[iVar27];
      c->x = fVar39 + (float)uVar4;
      c->y = (float)uVar9 + 0.0;
      stbtt__csctx_v(c,'\x02',(int)(fVar39 + (float)uVar4),(int)((float)uVar9 + 0.0),0,0,0,0);
      iVar27 = iVar27 + 1;
LAB_00141c53:
      if ((int)uVar35 <= iVar27) break;
      uVar5 = c->x;
      uVar10 = c->y;
      fVar39 = s[iVar27];
      c->x = (float)uVar5 + 0.0;
      c->y = fVar39 + (float)uVar10;
      stbtt__csctx_v(c,'\x02',(int)((float)uVar5 + 0.0),(int)(fVar39 + (float)uVar10),0,0,0,0);
    }
    goto LAB_00141cab;
  case 7:
    iVar27 = 0;
    if (0 < (int)uVar35) goto LAB_00141c53;
    return 0;
  case 8:
    if ((int)uVar35 < 6) {
      return 0;
    }
    uVar38 = 5;
    do {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar38 - 1],afStack_1d8[uVar38],afStack_1d8[uVar38 + 1],s[uVar38 - 2]
                 ,s[uVar38 - 1],s[uVar38]);
      uVar38 = uVar38 + 6;
    } while (uVar38 < uVar36);
    goto LAB_00141cab;
  case 10:
    bVar12 = true;
    if ((!bVar14) && (uVar23 = (local_1d0->fdselect).size, uVar23 != 0)) {
      puVar30 = (local_1d0->fdselect).data;
      uVar21 = '\0';
      uVar28 = 0;
      if ((int)uVar23 < 0) {
        uVar28 = uVar23;
      }
      if (0 < (int)uVar23) {
        uVar21 = puVar30[uVar28];
        uVar28 = 1;
      }
      if (uVar21 == '\0') {
        uVar28 = uVar28 + glyph_index;
        uVar29 = uVar28;
        if ((int)uVar23 < (int)uVar28) {
          uVar29 = uVar23;
        }
        if ((int)uVar28 < 0) {
          uVar29 = uVar23;
        }
        uVar24 = 0;
        if ((int)uVar29 < (int)uVar23) {
          uVar24 = (uint)puVar30[(int)uVar29];
        }
      }
      else {
        if (uVar21 == '\x03') {
          uVar29 = 0;
          iVar18 = 2;
          do {
            if ((int)uVar28 < (int)uVar23) {
              lVar32 = (long)(int)uVar28;
              uVar28 = uVar28 + 1;
              uVar24 = (uint)puVar30[lVar32];
            }
            else {
              uVar24 = 0;
            }
            uVar29 = uVar29 << 8 | uVar24;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
          uVar31 = 0;
          iVar18 = 2;
          do {
            if ((int)uVar28 < (int)uVar23) {
              lVar32 = (long)(int)uVar28;
              uVar28 = uVar28 + 1;
              uVar24 = (uint)puVar30[lVar32];
            }
            else {
              uVar24 = 0;
            }
            uVar31 = uVar31 << 8 | uVar24;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
          if (0 < (int)uVar29) {
            uVar33 = 0;
            do {
              if ((int)uVar28 < (int)uVar23) {
                lVar32 = (long)(int)uVar28;
                uVar28 = uVar28 + 1;
                uVar24 = (uint)puVar30[lVar32];
              }
              else {
                uVar24 = 0;
              }
              uVar34 = 0;
              iVar18 = 2;
              do {
                if ((int)uVar28 < (int)uVar23) {
                  lVar32 = (long)(int)uVar28;
                  uVar28 = uVar28 + 1;
                  uVar25 = (uint)puVar30[lVar32];
                }
                else {
                  uVar25 = 0;
                }
                uVar34 = uVar34 << 8 | uVar25;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
              if (glyph_index < (int)uVar34 && (int)uVar31 <= glyph_index) goto LAB_001419d1;
              uVar33 = uVar33 + 1;
              uVar31 = uVar34;
            } while (uVar33 != uVar29);
          }
        }
        uVar24 = 0xffffffff;
      }
LAB_001419d1:
      stbtt__cff_index_get(local_1d0->fontdicts,uVar24);
      sVar44.data._4_4_ = uVar19;
      sVar44.data._0_4_ = uVar26;
      sVar44.cursor = (int)in_stack_fffffffffffffdb8;
      sVar44.size = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      fontdict.cursor = in_stack_fffffffffffffde0;
      fontdict.data = (uchar *)uVar45;
      fontdict.size = glyph_index;
      local_108 = stbtt__get_subrs(sVar44,fontdict);
      bVar12 = true;
    }
    goto LAB_00141a22;
  case 0xb:
    if (iVar27 < 1) {
      return 0;
    }
    local_230 = (ulong)(iVar27 - 1);
    local_258 = *(undefined4 *)&subr_stack[local_230].data;
    uStack_254 = *(undefined4 *)((long)&subr_stack[local_230].data + 4);
    uVar26 = subr_stack[local_230].cursor;
    uVar19 = subr_stack[local_230].size;
    uVar37 = uVar36;
    break;
  case 0xc:
    lVar32 = (long)(int)uVar26;
    uVar22 = 0;
    if ((int)uVar26 < (int)uVar19) {
      uVar26 = uVar23 + 2;
      uVar22 = *(undefined1 *)(CONCAT44(uStack_254,local_258) + lVar32);
    }
    switch(uVar22) {
    case 0x22:
      if ((int)uVar35 < 7) {
        return 0;
      }
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      dy2 = -fVar40;
      dy1 = 0.0;
      fVar39 = 0.0;
      break;
    case 0x23:
      if ((int)uVar35 < 0xd) {
        return 0;
      }
      local_f8 = s[10];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar42 = dx3;
      fVar43 = fVar15;
      dx3 = local_f8;
      break;
    case 0x24:
      if ((int)uVar35 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      fVar39 = -(local_f8 + fVar41 + dy1);
      fVar42 = fVar43;
      dy2 = dy1;
      fVar43 = dx3;
      dy1 = 0.0;
      dx3 = fVar15;
      break;
    case 0x25:
      if ((int)uVar35 < 0xb) {
        return 0;
      }
      fVar39 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar41 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar42 = ABS(fVar39);
      fVar43 = ABS(fVar41);
      fVar40 = s[10];
      if (fVar42 <= fVar43) {
        fVar40 = -fVar39;
      }
      uVar23 = -(uint)(fVar43 < fVar42);
      fVar39 = (float)(~uVar23 & (uint)s[10] | (uint)-fVar41 & uVar23);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar42 = dx3;
      fVar43 = fVar15;
      dx3 = fVar40;
      break;
    default:
      goto switchD_0014140a_default;
    }
    goto LAB_001413b3;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar13) {
      uVar45 = (ulong)(uint)((int)uVar45 + ((int)((int)(uVar36 >> 0x1f) + uVar35) >> 1));
    }
    iVar18 = (int)uVar45 + 7;
    iVar27 = (int)uVar45 + 0xe;
    if (-1 < iVar18) {
      iVar27 = iVar18;
    }
    uVar23 = (iVar27 >> 3) + uVar26;
    uVar26 = uVar23;
    if ((int)uVar19 < (int)uVar23) {
      uVar26 = uVar19;
    }
    if ((int)uVar23 < 0) {
      uVar26 = uVar19;
    }
    goto LAB_00141721;
  case 0x15:
    if ((int)uVar35 < 2) {
      return 0;
    }
    fVar40 = s[uVar35 - 2];
    fVar39 = s[uVar35 - 1];
    goto LAB_001416eb;
  case 0x16:
    if ((int)uVar35 < 1) {
      return 0;
    }
    fVar40 = s[uVar35 - 1];
    fVar39 = 0.0;
LAB_001416eb:
    stbtt__csctx_rmove_to(c,fVar40,fVar39);
LAB_00141721:
    bVar13 = false;
    uVar37 = 0;
    break;
  case 0x18:
    if ((int)uVar35 < 8) {
      return 0;
    }
    lVar32 = -6;
    do {
      lVar17 = lVar32;
      stbtt__csctx_rccurve_to
                (c,s[lVar17 + 6],s[lVar17 + 7],s[lVar17 + 8],s[lVar17 + 9],s[lVar17 + 10],
                 s[lVar17 + 0xb]);
      lVar32 = lVar17 + 6;
    } while (lVar17 + 6 < (long)(int)uVar35 + -0xd);
    if ((int)uVar35 <= (int)lVar17 + 0xd) {
      return 0;
    }
    uVar3 = c->x;
    uVar8 = c->y;
    fVar39 = (float)uVar3 + (float)*(undefined8 *)(s + lVar17 + 0xc);
    fVar40 = (float)uVar8 + (float)((ulong)*(undefined8 *)(s + lVar17 + 0xc) >> 0x20);
    c->x = fVar39;
    c->y = fVar40;
    stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
    uVar37 = 0;
    break;
  case 0x19:
    if ((int)uVar35 < 8) {
      return 0;
    }
    lVar32 = 5;
    do {
      lVar17 = lVar32;
      uVar1 = c->x;
      uVar6 = c->y;
      fVar39 = (float)uVar1 + (float)*(undefined8 *)(afStack_1d8 + lVar17 + -1);
      fVar40 = (float)uVar6 + (float)((ulong)*(undefined8 *)(afStack_1d8 + lVar17 + -1) >> 0x20);
      c->x = fVar39;
      c->y = fVar40;
      stbtt__csctx_v(c,'\x02',(int)fVar39,(int)fVar40,0,0,0,0);
      lVar32 = lVar17 + 2;
    } while (lVar17 + -2 < (long)(int)(uVar35 - 6));
    if ((int)uVar35 <= (int)lVar32) {
      return 0;
    }
    fVar39 = s[lVar32];
    fVar42 = afStack_1d8[lVar17 + 1];
    dy2 = s[lVar17];
    fVar43 = afStack_1d8[lVar17 + 3];
    dy1 = afStack_1d8[lVar32];
    dx3 = s[lVar17 + 1];
LAB_001413b3:
    stbtt__csctx_rccurve_to(c,fVar42,dy1,fVar43,dy2,dx3,fVar39);
    goto LAB_00141cab;
  case 0x1a:
  case 0x1b:
    if ((int)uVar35 < 4) {
      return 0;
    }
    uVar38 = (ulong)(uVar35 & 1);
    if ((int)((uVar35 & 1) + 3) < (int)uVar35) {
      fVar39 = 0.0;
      if ((uVar36 & 1) != 0) {
        fVar39 = s[0];
      }
      do {
        iVar27 = (int)uVar38;
        fVar40 = s[uVar38];
        if (bVar11 == 0x1b) {
          fVar42 = fVar40;
          fVar43 = 0.0;
          fVar41 = s[iVar27 + 3];
          fVar40 = fVar39;
        }
        else {
          fVar41 = 0.0;
          fVar42 = fVar39;
          fVar43 = s[iVar27 + 3];
        }
        stbtt__csctx_rccurve_to(c,fVar42,fVar40,s[uVar38 + 1],s[uVar38 + 2],fVar41,fVar43);
        uVar38 = uVar38 + 4;
        fVar39 = 0.0;
      } while (iVar27 + 7 < (int)uVar35);
    }
    goto LAB_00141cab;
  case 0x1d:
    bVar12 = bVar14;
LAB_00141a22:
    if ((int)uVar35 < 1) {
      return 0;
    }
    if (9 < iVar27) {
      return 0;
    }
    fVar39 = s[uVar35 - 1];
    *(undefined4 *)&subr_stack[iVar27].data = local_258;
    *(undefined4 *)((long)&subr_stack[iVar27].data + 4) = uStack_254;
    subr_stack[iVar27].cursor = uVar26;
    subr_stack[iVar27].size = uVar19;
    piVar20 = &local_108.cursor;
    puVar30 = local_108.data;
    if (bVar11 != 10) {
      puVar30 = (local_1d0->gsubrs).data;
      piVar20 = local_e0;
    }
    local_230 = (ulong)(iVar27 + 1);
    uVar23 = (uint)(*(ulong *)piVar20 >> 0x20);
    uVar26 = (int)uVar23 >> 0x1f & uVar23;
    uVar19 = 0;
    iVar27 = 2;
    do {
      if ((int)uVar26 < (int)uVar23) {
        lVar32 = (long)(int)uVar26;
        uVar26 = uVar26 + 1;
        uVar28 = (uint)puVar30[lVar32];
      }
      else {
        uVar28 = 0;
      }
      uVar19 = uVar19 << 8 | uVar28;
      iVar27 = iVar27 + -1;
    } while (iVar27 != 0);
    uVar23 = (uint)(0x4d7 < (int)uVar19) << 10 | 0x6b;
    if (0x846b < (int)uVar19) {
      uVar23 = 0x8000;
    }
    iVar27 = uVar23 + (int)fVar39;
    sVar44 = (stbtt__buf)ZEXT816(0);
    if (iVar27 < (int)uVar19 && -1 < iVar27) {
      b._8_8_ = (ulong)uVar26 | *(ulong *)piVar20 & 0xffffffff00000000;
      b.data = puVar30;
      sVar44 = stbtt__cff_index_get(b,iVar27);
    }
    local_258 = sVar44.data._0_4_;
    uStack_254 = sVar44.data._4_4_;
    uVar19 = sVar44.size;
    if (uVar19 == 0) {
      return 0;
    }
    uVar26 = 0;
    uVar37 = (ulong)(uVar35 - 1);
    bVar14 = bVar12;
    break;
  case 0x1e:
    iVar27 = 0;
    if ((int)uVar35 < 4) {
      return 0;
    }
    for (; iVar27 + 3 < (int)uVar35; iVar27 = iVar27 + 4) {
      fVar39 = 0.0;
      if (uVar35 - iVar27 == 5) {
        fVar39 = s[(long)iVar27 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar27],s[(long)iVar27 + 1],s[(long)iVar27 + 2],s[iVar27 + 3],fVar39);
      iVar27 = iVar27 + 4;
LAB_00141ba7:
      if ((int)uVar35 <= iVar27 + 3) break;
      fVar39 = 0.0;
      if (uVar35 - iVar27 == 5) {
        fVar39 = s[(long)iVar27 + 4];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar27],0.0,s[(long)iVar27 + 1],s[(long)iVar27 + 2],fVar39,s[iVar27 + 3]);
    }
LAB_00141cab:
    uVar37 = 0;
    break;
  case 0x1f:
    iVar27 = 0;
    if (3 < (int)uVar35) goto LAB_00141ba7;
    return 0;
  default:
    if (bVar11 != 0xff) goto switchD_00141069_caseD_2;
LAB_0014117f:
    uVar23 = 0;
    iVar27 = 4;
    do {
      if ((int)uVar26 < (int)uVar19) {
        lVar32 = (long)(int)uVar26;
        uVar26 = uVar26 + 1;
        uVar28 = (uint)*(byte *)(CONCAT44(uStack_254,local_258) + lVar32);
      }
      else {
        uVar28 = 0;
      }
      uVar23 = uVar23 << 8 | uVar28;
      iVar27 = iVar27 + -1;
    } while (iVar27 != 0);
    fVar39 = (float)(int)uVar23 * 1.5258789e-05;
    goto LAB_001411be;
  }
  uVar38 = (ulong)uVar26;
  uVar36 = uVar37;
  if ((int)uVar19 <= (int)uVar26) {
    return 0;
  }
  goto LAB_0014103f;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}